

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

const_iterator __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
::find_as<unsigned_int>
          (DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
           *this,uint *Val)

{
  bool bVar1;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *E;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *local_30;
  DenseSetPair<llvm::DWARFDebugNames::Abbrev> *TheBucket;
  uint *Val_local;
  DenseMapBase<llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>
  *this_local;
  
  TheBucket = (DenseSetPair<llvm::DWARFDebugNames::Abbrev> *)Val;
  Val_local = (uint *)this;
  bVar1 = LookupBucketFor<unsigned_int>(this,Val,&local_30);
  if (bVar1) {
    E = getBucketsEnd(this);
    _this_local = makeConstIterator(this,local_30,E,(DebugEpochBase *)this,true);
  }
  else {
    _this_local = end(this);
  }
  return _this_local;
}

Assistant:

const_iterator find_as(const LookupKeyT &Val) const {
    const BucketT *TheBucket;
    if (LookupBucketFor(Val, TheBucket))
      return makeConstIterator(TheBucket, getBucketsEnd(), *this, true);
    return end();
  }